

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsHessian_ASA_FSA.c
# Opt level: O0

int fQB1(sunrealtype t,N_Vector y,N_Vector *yS,N_Vector yB,N_Vector qBdot,void *user_dataB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  sunrealtype m3;
  sunrealtype m1;
  sunrealtype l3;
  sunrealtype l1;
  sunrealtype s3;
  sunrealtype s2;
  sunrealtype s1;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  sunrealtype p2;
  UserData data;
  void *user_dataB_local;
  N_Vector qBdot_local;
  N_Vector yB_local;
  N_Vector *yS_local;
  
  dVar1 = *(double *)((long)user_dataB + 8);
  dVar2 = **(double **)((long)y->content + 0x10);
  dVar3 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  dVar4 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  dVar5 = **(double **)((long)(*yS)->content + 0x10);
  dVar6 = *(double *)(*(long *)((long)(*yS)->content + 0x10) + 8);
  dVar7 = *(double *)(*(long *)((long)(*yS)->content + 0x10) + 0x10);
  dVar8 = **(double **)((long)yB->content + 0x10);
  dVar9 = *(double *)(*(long *)((long)yB->content + 0x10) + 0x10);
  dVar10 = *(double *)(*(long *)((long)yB->content + 0x10) + 0x18);
  dVar11 = *(double *)(*(long *)((long)yB->content + 0x10) + 0x28);
  **(double **)((long)qBdot->content + 0x10) = -dVar2 * dVar2 * dVar8;
  *(double *)(*(long *)((long)qBdot->content + 0x10) + 8) = dVar1 * -2.0 * dVar3 * dVar4 * dVar9;
  *(double *)(*(long *)((long)qBdot->content + 0x10) + 0x10) =
       -dVar2 * dVar2 * dVar10 + -(dVar8 * 2.0 * dVar2 * dVar5);
  *(double *)(*(long *)((long)qBdot->content + 0x10) + 0x18) =
       dVar1 * -2.0 * dVar3 * dVar4 * dVar11 +
       -(dVar9 * 2.0 * (dVar1 * dVar4 * dVar6 + dVar1 * dVar3 * dVar7));
  return 0;
}

Assistant:

static int fQB1(sunrealtype t, N_Vector y, N_Vector* yS, N_Vector yB,
                N_Vector qBdot, void* user_dataB)
{
  UserData data;
  sunrealtype p2;
  sunrealtype y1, y2, y3; /* solution */
  sunrealtype s1, s2, s3; /* sensitivity 1 */
  sunrealtype l1, l3;     /* lambda */
  sunrealtype m1, m3;     /* mu */

  data = (UserData)user_dataB;

  p2 = data->p2;

  y1 = Ith(y, 1);
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  s1 = Ith(yS[0], 1);
  s2 = Ith(yS[0], 2);
  s3 = Ith(yS[0], 3);

  l1 = Ith(yB, 1);
  l3 = Ith(yB, 3);

  m1 = Ith(yB, 4);
  m3 = Ith(yB, 6);

  Ith(qBdot, 1) = -y1 * y1 * l1;
  Ith(qBdot, 2) = -2.0 * p2 * y2 * y3 * l3;

  Ith(qBdot, 3) = -y1 * y1 * m1 - l1 * 2.0 * y1 * s1;
  Ith(qBdot, 4) = -2.0 * p2 * y2 * y3 * m3 -
                  l3 * 2.0 * (p2 * y3 * s2 + p2 * y2 * s3);

  return (0);
}